

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOptimizationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Performance::anon_unknown_1::ShaderOptimizationCase::ShaderOptimizationCase
          (ShaderOptimizationCase *this,Context *context,char *name,char *description,
          CaseShaderType caseShaderType)

{
  RenderContext *renderCtx;
  PerfCaseType local_5c;
  CaseShaderType caseShaderType_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  ShaderOptimizationCase *this_local;
  
  TestCase::TestCase(&this->super_TestCase,context,NODETYPE_PERFORMANCE,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderOptimizationCase_015aed58;
  this->m_caseShaderType = caseShaderType;
  this->m_state = STATE_LAST;
  renderCtx = Context::getRenderContext(context);
  if (caseShaderType == CASESHADERTYPE_VERTEX) {
    local_5c = CASETYPE_VERTEX;
  }
  else {
    local_5c = CASETYPE_LAST;
    if (caseShaderType == CASESHADERTYPE_FRAGMENT) {
      local_5c = CASETYPE_FRAGMENT;
    }
  }
  deqp::gls::ShaderPerformanceMeasurer::ShaderPerformanceMeasurer
            (&this->m_measurer,renderCtx,local_5c);
  ProgramData::ProgramData(&this->m_unoptimizedData);
  ProgramData::ProgramData(&this->m_optimizedData);
  de::SharedPtr<const_glu::ShaderProgram>::SharedPtr(&this->m_unoptimizedProgram);
  de::SharedPtr<const_glu::ShaderProgram>::SharedPtr(&this->m_optimizedProgram);
  deqp::gls::ShaderPerformanceMeasurer::Result::Result(&this->m_unoptimizedResult,-1.0,-1.0);
  deqp::gls::ShaderPerformanceMeasurer::Result::Result(&this->m_optimizedResult,-1.0,-1.0);
  return;
}

Assistant:

ShaderOptimizationCase (Context& context, const char* name, const char* description, CaseShaderType caseShaderType)
		: TestCase				(context, tcu::NODETYPE_PERFORMANCE, name, description)
		, m_caseShaderType		(caseShaderType)
		, m_state				(STATE_LAST)
		, m_measurer			(context.getRenderContext(), caseShaderType == CASESHADERTYPE_VERTEX	? gls::CASETYPE_VERTEX
														   : caseShaderType == CASESHADERTYPE_FRAGMENT	? gls::CASETYPE_FRAGMENT
														   : gls::CASETYPE_LAST)
		, m_unoptimizedResult	(-1.0f, -1.0f)
		, m_optimizedResult		(-1.0f, -1.0f)
	{
	}